

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

ParamAssignmentSyntax * __thiscall slang::parsing::Parser::parseParamValue(Parser *this)

{
  Token openParen;
  bool bVar1;
  SourceLocation location;
  OrderedParamAssignmentSyntax *pOVar2;
  ExpressionSyntax *pEVar3;
  NamedParamAssignmentSyntax *pNVar4;
  Token dot;
  Token name;
  Token start;
  Token local_68;
  Token local_58;
  Token local_48;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
  if (bVar1) {
    dot = ParserBase::consume(&this->super_ParserBase);
    name = ParserBase::expect(&this->super_ParserBase,Identifier);
    local_68 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    if (((undefined1  [16])local_68 & (undefined1  [16])0x10000) == (undefined1  [16])0x0) {
      bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
      if (bVar1) {
        pEVar3 = (ExpressionSyntax *)0x0;
      }
      else {
        pEVar3 = parseMinTypMaxExpression
                           (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      }
      local_58 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    }
    else {
      location = Token::location(&local_68);
      local_58 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,location);
      pEVar3 = (ExpressionSyntax *)0x0;
    }
    openParen = local_68;
    local_48.kind = local_68.kind;
    local_48._2_1_ = local_68._2_1_;
    local_48.numFlags.raw = local_68.numFlags.raw;
    local_48.rawLen = local_68.rawLen;
    local_48.info = local_68.info;
    local_68 = openParen;
    pNVar4 = slang::syntax::SyntaxFactory::namedParamAssignment
                       (&this->factory,dot,name,openParen,pEVar3,local_58);
    return &pNVar4->super_ParamAssignmentSyntax;
  }
  pEVar3 = parseMinTypMaxExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
  pOVar2 = slang::syntax::SyntaxFactory::orderedParamAssignment(&this->factory,pEVar3);
  return &pOVar2->super_ParamAssignmentSyntax;
}

Assistant:

ParamAssignmentSyntax& Parser::parseParamValue() {
    // check for named arguments
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        auto [innerOpenParen, innerCloseParen,
              expr] = parseGroupOrSkip(TokenKind::OpenParenthesis, TokenKind::CloseParenthesis,
                                       [this]() { return &parseMinTypMaxExpression(); });

        return factory.namedParamAssignment(dot, name, innerOpenParen, expr, innerCloseParen);
    }

    return factory.orderedParamAssignment(parseMinTypMaxExpression());
}